

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseBandwidth.cpp
# Opt level: O0

void __thiscall tonk::ReceiverStatistics::Compress(ReceiverStatistics *this,uint8_t *buffer)

{
  uint uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int lossRateInt;
  uint8_t lossRateByte;
  uint8_t *buffer_local;
  ReceiverStatistics *this_local;
  uint shift_1;
  uint nonzeroBits_1;
  ushort local_32;
  uint shift;
  uint nonzeroBits;
  ushort local_24;
  
  lossRateByte = '\0';
  if (0.0 < this->LossRate) {
    auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0x43800000),0),ZEXT416((uint)this->LossRate),
                             SUB6416(ZEXT464(0x3f000000),0));
    iVar3 = (int)auVar2._0_4_;
    if (0 < iVar3) {
      if (iVar3 < 0xff) {
        lossRateByte = (uint8_t)iVar3;
      }
      else {
        lossRateByte = 0xff;
      }
    }
  }
  *buffer = lossRateByte;
  uVar1 = this->GoodputBPS;
  if (uVar1 == 0) {
    local_24 = 0;
  }
  else if (-LZCOUNT(uVar1) + 0x20U < 0xc) {
    local_24 = (ushort)uVar1;
  }
  else {
    iVar3 = -LZCOUNT(uVar1) + 0x15;
    local_24 = (ushort)(uVar1 >> ((byte)iVar3 & 0x1f)) | (short)iVar3 * 0x800;
  }
  *(ushort *)(buffer + 1) = local_24;
  uVar1 = this->TripUsec;
  if (uVar1 == 0) {
    local_32 = 0;
  }
  else if (-LZCOUNT(uVar1) + 0x20U < 0xc) {
    local_32 = (ushort)uVar1;
  }
  else {
    iVar3 = -LZCOUNT(uVar1) + 0x15;
    local_32 = (ushort)(uVar1 >> ((byte)iVar3 & 0x1f)) | (short)iVar3 * 0x800;
  }
  *(ushort *)(buffer + 3) = local_32;
  return;
}

Assistant:

void ReceiverStatistics::Compress(uint8_t* buffer) const
{
    uint8_t lossRateByte = 0;
    if (LossRate > 0.f)
    {
        const int lossRateInt = static_cast<int>(LossRate * 256.f + 0.5f);
        if (lossRateInt > 0)
        {
            if (lossRateInt >= 255) {
                lossRateByte = 255;
            }
            else {
                lossRateByte = static_cast<uint8_t>(lossRateInt);
            }
        }
    }
    buffer[0] = lossRateByte;

    siamese::WriteU16_LE(buffer + 1, FixedPointCompress32to16(GoodputBPS));
    siamese::WriteU16_LE(buffer + 3, FixedPointCompress32to16(TripUsec));
}